

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expertInline.hpp
# Opt level: O3

Scal __thiscall LinearExpert<1,_1>::queryZ(LinearExpert<1,_1> *this,Z *z)

{
  policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
  *pol;
  detail *this_00;
  longdouble in_ST0;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 local_41 [9];
  longdouble local_38;
  double local_28;
  double local_20;
  double local_18;
  
  dVar1 = (z->super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>).m_storage.m_data.array
          [0] - (this->Nu).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.
                m_data.array[0];
  (this->dz).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array[0]
       = dVar1;
  (this->pred_x).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array
  [0] = (this->Lambda).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data
        .array[0] * dVar1 +
        (this->Mu).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.
        array[0];
  dVar4 = this->wSigma + this->Sh;
  dVar3 = dVar4 + -1.0 + 1.0;
  local_38 = (longdouble)CONCAT28(local_38._8_2_,dVar3);
  dVar2 = this->Sh + this->wNu;
  local_28 = (dVar4 + 1.0 + *(double *)(&DAT_00168280 + (ulong)(-(uint)(this->wNu == 0.0) & 1) * 8))
             * ((dVar2 + 1.0) / dVar2);
  dVar2 = (this->invSigma).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.
          m_data.array[0] * dVar1;
  dVar1 = dVar1 * dVar2;
  this->dz_invSigma_dz = dVar1;
  dVar1 = dVar1 / local_28 + 1.0;
  dVar3 = dVar3 + 1.0;
  (this->kappa).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array
  [0] = ((dVar3 / local_28) / dVar1) * dVar2;
  this_00 = (detail *)z;
  dVar1 = pow(dVar1,dVar3 * -0.5);
  this->rbf_z = dVar1;
  local_41._1_8_ = this->sqrtDetInvSigma;
  local_18 = local_38._0_8_ * 0.5;
  boost::math::detail::
  tgamma_delta_ratio_imp<long_double,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
            ((longdouble *)local_41,this_00,(longdouble)local_18,(longdouble)0.5,pol);
  if ((longdouble)1.79769313486232e+308 < ABS(in_ST0)) {
    local_38 = in_ST0;
    boost::math::policies::detail::raise_error<std::overflow_error,double>
              ("boost::math::tgamma_delta_ratio<%1%>(%1%, %1%)","numeric overflow");
    in_ST0 = local_38;
  }
  local_20 = (double)in_ST0;
  local_41._1_8_ = (double)local_41._1_8_ / local_20;
  dVar1 = pow(2.0 / local_28,0.5);
  dVar1 = dVar1 * (double)local_41._1_8_ * this->rbf_z;
  this->p_z_T = dVar1;
  dVar3 = (z->super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>).m_storage.m_data.array
          [0] - (this->Sz).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.
                m_data.array[0] / this->Sh;
  dVar2 = (this->varLambda).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.
          m_data.array[0] * dVar3;
  this->gamma = dVar3 * dVar2 + 1.0 / this->Sh;
  (this->dGamma).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array
  [0] = dVar2 + dVar2;
  return dVar1;
}

Assistant:

EXPERT_CLASS_TEMPLATE
Scal LINEAR_EXPERT_base::queryZ( Z const &z )
{
    dz = z - Nu;
    pred_x = Lambda * dz + Mu;

    Scal dof = wSigma + Sh - d + 1.0;
    Scal aux1 = (wNu + Sh + 1.0) / (wNu + Sh) * (wSigma + Sh + d + (wNu == 0.0 ? 1.0 : 2.0));

    Z aux2 = invSigma * dz;
    dz_invSigma_dz = dz.dot( aux2 );
    Scal aux3 = 1.0 + dz_invSigma_dz / aux1;
    kappa = ( (dof+d)/aux1/aux3 ) * aux2;

    rbf_z = pow(aux3 , -0.5*(dof+d) );
    p_z_T = sqrtDetInvSigma / boost::math::tgamma_delta_ratio(0.5*dof, 0.5*d) * pow(2.0/aux1, 0.5*d) * rbf_z;

    Z dzAux = z - Sz/Sh;
    dGamma = varLambda * dzAux;
    gamma = 1.0/Sh + dzAux.dot( dGamma );
    dGamma *= 2.0;

    return p_z_T;
}